

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::bldFineLevels(Amr *this,Real strt_time)

{
  pointer puVar1;
  tuple<amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> tVar2;
  bool bVar3;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var4;
  long lVar5;
  ulong uVar6;
  int i;
  long lVar7;
  uint uVar8;
  bool bVar9;
  int new_finest;
  Real local_60;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> new_grids;
  DistributionMapping new_dm;
  
  *(undefined4 *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c = 0;
  local_60 = strt_time;
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::vector
            (&new_grids.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
             (long)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level + 1,
             (allocator_type *)&new_dm);
  uVar6 = (ulong)*(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  do {
    grid_places(this,(int)uVar6,local_60,&new_finest,
                (Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                &new_grids.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
    uVar8 = *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    uVar6 = (ulong)uVar8;
    if (new_finest <= (int)uVar8) break;
    *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c = new_finest;
    DistributionMapping::DistributionMapping
              (&new_dm,new_grids.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl
                       .super__Vector_impl_data._M_start + new_finest,
               *(int *)(ParallelContext::frames + 0x10));
    lVar5 = (long)new_finest;
    _Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (__uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>)
         (**(code **)(*(long *)this->levelbld + 0x30))
                   (local_60,this->levelbld,this,lVar5,
                    (this->super_AmrCore).super_AmrMesh.geom.
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar5,
                    new_grids.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                    super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar5,(allocator_type *)&new_dm);
    lVar5 = (long)new_finest;
    puVar1 = (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    tVar2.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_> *)
          &puVar1[lVar5]._M_t.
           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    puVar1[lVar5]._M_t.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
         = _Var4.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
           super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl;
    if (tVar2.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl !=
        (_Head_base<0UL,_amrex::AmrLevel_*,_false>)0x0) {
      (**(code **)(*(long *)tVar2.
                            super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                            .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 8))();
      lVar5 = (long)new_finest;
    }
    AmrMesh::SetBoxArray
              ((AmrMesh *)this,new_finest,
               new_grids.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
               super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
               super__Vector_impl_data._M_start + lVar5);
    AmrMesh::SetDistributionMap((AmrMesh *)this,new_finest,&new_dm);
    (**(code **)(*(long *)(this->amr_level).
                          super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          .
                          super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[new_finest]._M_t.
                          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                + 0xb8))();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_dm.m_ref.
                super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    uVar8 = *(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    uVar6 = (ulong)uVar8;
  } while ((int)uVar8 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level);
  if (((this->regrid_grids_file)._M_string_length == 0) ||
     (((local_60 == 0.0 && (!NAN(local_60))) && ((this->initial_grids_file)._M_string_length != 0)))
     ) {
    uVar8 = 0;
    do {
      lVar5 = 0;
      for (lVar7 = 0; lVar7 <= (int)uVar6; lVar7 = lVar7 + 1) {
        BoxArray::operator=((BoxArray *)
                            ((long)&((new_grids.
                                      super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                      .
                                      super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type
                            + lVar5),(BoxArray *)
                                     ((long)(this->amr_level).
                                            super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                            .
                                            super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_t.
                                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                     + 0xd8));
        uVar6 = (ulong)*(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
        lVar5 = lVar5 + 0x68;
      }
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[7])(local_60,this,0,1);
      bVar3 = true;
      lVar5 = 0;
      lVar7 = 0;
      while ((uVar6 = (ulong)*(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
             lVar7 <= (long)uVar6 && (bVar3 != false))) {
        bVar3 = BoxArray::operator==
                          ((BoxArray *)
                           ((long)&((new_grids.
                                     super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                     .
                                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                           lVar5),(BoxArray *)
                                  ((long)(this->amr_level).
                                         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         .
                                         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar7]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  + 0xd8));
        lVar7 = lVar7 + 1;
        lVar5 = lVar5 + 0x68;
      }
      bVar9 = uVar8 < 3;
      uVar8 = uVar8 + 1;
    } while (bVar3 == false && bVar9);
  }
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::~vector
            (&new_grids.super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>);
  return;
}

Assistant:

void
Amr::bldFineLevels (Real strt_time)
{
    BL_PROFILE("Amr::bldFineLevels()");
    finest_level = 0;

    Vector<BoxArray> new_grids(max_level+1);
    //
    // Get initial grid placement.
    //
    do
    {
        int new_finest;

        grid_places(finest_level,strt_time,new_finest,new_grids);

        if (new_finest <= finest_level) break;
        //
        // Create a new level and link with others.
        //
        finest_level = new_finest;

        DistributionMapping new_dm {new_grids[new_finest]};

        AmrLevel* level = (*levelbld)(*this,
                                      new_finest,
                                      Geom(new_finest),
                                      new_grids[new_finest],
                                      new_dm,
                                      strt_time);

        amr_level[new_finest].reset(level);
        this->SetBoxArray(new_finest, new_grids[new_finest]);
        this->SetDistributionMap(new_finest, new_dm);

        amr_level[new_finest]->initData();
    }
    while (finest_level < max_level);
    //
    // Iterate grids to ensure fine grids encompass all interesting gunk.
    //     but only iterate if we did not provide a grids file.
    //
    if ( regrid_grids_file.empty() || (strt_time == 0.0 && !initial_grids_file.empty()) )
    {
        bool grids_the_same;

        const int MaxCnt = 4;

        int count = 0;

        do
        {
            for (int i = 0; i <= finest_level; i++) {
                new_grids[i] = amr_level[i]->boxArray();
            }

            regrid(0,strt_time,true);

            grids_the_same = true;

            for (int i = 0; i <= finest_level && grids_the_same; i++) {
                if (!(new_grids[i] == amr_level[i]->boxArray())) {
                    grids_the_same = false;
                }
            }

            count++;
        }
        while (!grids_the_same && count < MaxCnt);
    }
}